

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acesup.c
# Opt level: O3

MovePack * acesup_movePackGet(Board *board)

{
  Card *pCVar1;
  byte *pbVar2;
  byte bVar3;
  MovePack *movePack;
  Spot *pSVar4;
  unsigned_long uVar5;
  Move *pMVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uchar suitTopRanks [4];
  Spot *tableaus [4];
  byte local_64 [4];
  Spot *local_60;
  long alStack_58 [5];
  
  movePack = movePack_create();
  lVar8 = 0;
  local_60 = board_spotGet(board,STOCK,'\0');
  local_64[0] = 0;
  local_64[1] = 0;
  local_64[2] = 0;
  local_64[3] = 0;
  do {
    pSVar4 = board_spotGet(board,TABLEAU,(uchar)lVar8);
    alStack_58[lVar8] = (long)pSVar4;
    if (pSVar4->cardsCount != 0) {
      uVar7 = 0;
      pCVar1 = pSVar4->cards[pSVar4->cardsCount - 1];
      do {
        if (uVar7 == pCVar1->suit) {
          bVar3 = pCVar1->rank;
          if (bVar3 == 1) {
            bVar3 = 0xe;
          }
          uVar5 = max((ulong)local_64[uVar7],(ulong)bVar3);
          local_64[uVar7] = (byte)uVar5;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != 4);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  lVar8 = 0;
  do {
    bVar3 = *(byte *)(alStack_58[lVar8] + 2);
    if (bVar3 != 0) {
      uVar7 = 0;
      pbVar2 = *(byte **)(*(long *)(alStack_58[lVar8] + 8) + (ulong)(bVar3 - 1) * 8);
      do {
        bVar3 = *pbVar2;
        if (((bVar3 != 1) && (uVar7 == pbVar2[1])) && (bVar3 < local_64[uVar7])) {
          pMVar6 = move_create(MOVE,TABLEAU,(uchar)lVar8,-1,FOUNDATION,'\0',-1);
          movePack_add(movePack,pMVar6);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != 4);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  lVar8 = 0;
  do {
    if (*(char *)(alStack_58[lVar8] + 2) != '\0') {
      lVar9 = 0;
      do {
        if ((lVar8 != lVar9) && (*(char *)(alStack_58[lVar9] + 2) == '\0')) {
          pMVar6 = move_create(MOVE,TABLEAU,(uchar)lVar8,-1,TABLEAU,(uchar)lVar9,-1);
          movePack_add(movePack,pMVar6);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  if (local_60->cardsCount != '\0') {
    pMVar6 = move_create(MOVEDISTRIBUTE,STOCK,'\0',-1,TABLEAU,'\x04',-1);
    movePack_add(movePack,pMVar6);
  }
  return movePack;
}

Assistant:

MovePack * acesup_movePackGet(Board * board)
{
	MovePack * movePack = movePack_create();
	unsigned char i, j;
	Spot * stock = board_spotGet(board, STOCK, 0);
	Spot * tableaus[4];
	unsigned char suitTopRanks[4] = {0,0,0,0};
	Card * card;

	for(i=0;i<4;i++)
	{
		tableaus[i] = board_spotGet(board, TABLEAU, i);
		if(tableaus[i]->cardsCount<1)
			continue;

		card = tableaus[i]->cards[tableaus[i]->cardsCount-1];
		for(j=0;j<4;j++)
		{
			if(card->suit==j)
				suitTopRanks[j] = max(suitTopRanks[j], (card->rank==1 ? 14 : card->rank));
		}
	}

	// Play card to foundation
	for(i=0;i<4;i++)
	{
		if(tableaus[i]->cardsCount<1)
			continue;

		card = tableaus[i]->cards[tableaus[i]->cardsCount-1];
		for(j=0;j<4;j++)
		{
			if(card->rank!=1 && card->suit==j && card->rank<suitTopRanks[j])
				movePack_add(movePack, move_create(MOVE, TABLEAU, i, -1, FOUNDATION, 0, -1));
		}
	}

	// Tableau to Tableau
	for(i=0;i<4;i++)
	{
		if(tableaus[i]->cardsCount<1)
			continue;

		for(j=0;j<4;j++)
		{
			if(i==j || tableaus[j]->cardsCount>0)
				continue;

			movePack_add(movePack, move_create(MOVE, TABLEAU, i, -1, TABLEAU, j, -1));
		}
	}

	// Play stock to tableau
	if(stock->cardsCount>0)
		movePack_add(movePack, move_create(MOVEDISTRIBUTE, STOCK, 0, -1, TABLEAU, 4, -1));

	return movePack;
}